

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.h
# Opt level: O3

PrimInfo * __thiscall
embree::avx2::LineSegmentsISA::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,LineSegmentsISA *this,mvector<PrimRef> *prims,
          size_t itime,range<unsigned_long> *r,size_t k,uint geomID)

{
  uint uVar1;
  BufferView<embree::Vec3fx> *pBVar2;
  char *pcVar3;
  PrimRef *pPVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  float fVar7;
  size_t sVar8;
  ulong uVar9;
  size_t *psVar10;
  ulong uVar11;
  long lVar12;
  size_t sVar13;
  ulong uVar14;
  unsigned_long uVar15;
  ulong uVar16;
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar22;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar23;
  undefined1 auVar24 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar25;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar26;
  undefined1 auVar27 [64];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  size_t local_60;
  undefined1 auVar19 [64];
  undefined1 auVar21 [64];
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar14 = r->_begin;
  uVar15 = r->_end;
  if (uVar14 < uVar15) {
    auVar18._8_4_ = 0xff800000;
    auVar18._0_8_ = 0xff800000ff800000;
    auVar18._12_4_ = 0xff800000;
    auVar19 = ZEXT1664(auVar18);
    auVar20._8_4_ = 0x7f800000;
    auVar20._0_8_ = 0x7f8000007f800000;
    auVar20._12_4_ = 0x7f800000;
    auVar21 = ZEXT1664(auVar20);
    local_60 = 0;
    auVar28._8_4_ = 0xddccb9a2;
    auVar28._0_8_ = 0xddccb9a2ddccb9a2;
    auVar28._12_4_ = 0xddccb9a2;
    auVar29._8_4_ = 0x5dccb9a2;
    auVar29._0_8_ = 0x5dccb9a25dccb9a2;
    auVar29._12_4_ = 0x5dccb9a2;
    auVar24 = ZEXT1664(auVar20);
    auVar27 = ZEXT1664(auVar18);
    do {
      pBVar2 = (this->super_LineSegments).vertices.items;
      uVar1 = *(uint *)(*(long *)&(this->super_LineSegments).super_Geometry.field_0x58 +
                       *(long *)&(this->super_LineSegments).field_0x68 * uVar14);
      uVar16 = (ulong)uVar1;
      uVar11 = (ulong)(uVar1 + 1);
      sVar13 = k;
      if (uVar11 < (pBVar2->super_RawBufferView).num) {
        psVar10 = &pBVar2[itime].super_RawBufferView.stride;
        sVar8 = itime;
        do {
          auVar18 = *(undefined1 (*) [16])
                     (((RawBufferView *)(psVar10 + -2))->ptr_ofs + *psVar10 * uVar16);
          auVar20 = vcmpps_avx(auVar18,auVar28,2);
          auVar30 = vcmpps_avx(auVar18,auVar29,5);
          auVar20 = vorps_avx(auVar20,auVar30);
          if ((((auVar20 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar20 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar20 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar20[0xf] < '\0') goto LAB_0198e6fc;
          auVar20 = *(undefined1 (*) [16])
                     (((RawBufferView *)(psVar10 + -2))->ptr_ofs + *psVar10 * uVar11);
          auVar30 = vcmpps_avx(auVar20,auVar28,2);
          auVar31 = vcmpps_avx(auVar20,auVar29,5);
          auVar30 = vorps_avx(auVar30,auVar31);
          if ((((auVar30 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar30 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar30 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar30[0xf] < '\0') goto LAB_0198e6fc;
          auVar18 = vshufps_avx(auVar18,auVar18,0xff);
          auVar20 = vshufps_avx(auVar20,auVar20,0xff);
          auVar18 = vminss_avx(auVar18,auVar20);
          if (auVar18._0_4_ < 0.0) goto LAB_0198e6fc;
          sVar8 = sVar8 + 1;
          psVar10 = psVar10 + 7;
        } while (sVar8 <= itime);
        psVar10 = &pBVar2[itime + 1].super_RawBufferView.stride;
        uVar9 = itime + 1;
        do {
          auVar18 = *(undefined1 (*) [16])
                     (((RawBufferView *)(psVar10 + -2))->ptr_ofs + *psVar10 * uVar16);
          auVar20 = vcmpps_avx(auVar18,auVar28,2);
          auVar30 = vcmpps_avx(auVar18,auVar29,5);
          auVar20 = vorps_avx(auVar20,auVar30);
          if ((((auVar20 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar20 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar20 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar20[0xf] < '\0') goto LAB_0198e6fc;
          auVar20 = *(undefined1 (*) [16])
                     (((RawBufferView *)(psVar10 + -2))->ptr_ofs + *psVar10 * uVar11);
          auVar30 = vcmpps_avx(auVar20,auVar28,2);
          auVar31 = vcmpps_avx(auVar20,auVar29,5);
          auVar30 = vorps_avx(auVar30,auVar31);
          if ((((auVar30 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar30 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar30 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar30[0xf] < '\0') goto LAB_0198e6fc;
          auVar18 = vshufps_avx(auVar18,auVar18,0xff);
          auVar20 = vshufps_avx(auVar20,auVar20,0xff);
          auVar18 = vminss_avx(auVar18,auVar20);
          if (auVar18._0_4_ < 0.0) goto LAB_0198e6fc;
          uVar9 = uVar9 + 1;
          psVar10 = psVar10 + 7;
        } while (uVar9 <= itime + 1);
        pcVar3 = pBVar2[itime].super_RawBufferView.ptr_ofs;
        sVar13 = pBVar2[itime].super_RawBufferView.stride;
        lVar17 = uVar16 * sVar13;
        lVar12 = uVar11 * sVar13;
        auVar20 = vminps_avx(*(undefined1 (*) [16])(pcVar3 + lVar17),
                             *(undefined1 (*) [16])(pcVar3 + lVar12));
        auVar18 = vmaxss_avx(ZEXT416(*(uint *)(pcVar3 + lVar12 + 0xc)),
                             ZEXT416(*(uint *)(pcVar3 + lVar17 + 0xc)));
        fVar7 = auVar18._0_4_ * (this->super_LineSegments).maxRadiusScale;
        auVar18 = vmaxps_avx(*(undefined1 (*) [16])(pcVar3 + lVar17),
                             *(undefined1 (*) [16])(pcVar3 + lVar12));
        auVar31._4_4_ = fVar7;
        auVar31._0_4_ = fVar7;
        auVar31._8_4_ = fVar7;
        auVar31._12_4_ = fVar7;
        auVar20 = vsubps_avx(auVar20,auVar31);
        aVar5 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                vinsertps_avx(auVar20,ZEXT416(geomID),0x30);
        auVar30._0_4_ = auVar18._0_4_ + fVar7;
        auVar30._4_4_ = auVar18._4_4_ + fVar7;
        auVar30._8_4_ = auVar18._8_4_ + fVar7;
        auVar30._12_4_ = auVar18._12_4_ + fVar7;
        aVar6 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                vinsertps_avx(auVar30,ZEXT416((uint)uVar14),0x30);
        auVar18 = vminps_avx(auVar21._0_16_,(undefined1  [16])aVar5);
        auVar21 = ZEXT1664(auVar18);
        auVar18 = vmaxps_avx(auVar19._0_16_,(undefined1  [16])aVar6);
        auVar19 = ZEXT1664(auVar18);
        auVar32._0_4_ = aVar5.x + aVar6.x;
        auVar32._4_4_ = aVar5.y + aVar6.y;
        auVar32._8_4_ = aVar5.z + aVar6.z;
        auVar32._12_4_ = aVar5.field_3.w + aVar6.field_3.w;
        auVar18 = vminps_avx(auVar24._0_16_,auVar32);
        auVar24 = ZEXT1664(auVar18);
        auVar18 = vmaxps_avx(auVar27._0_16_,auVar32);
        auVar27 = ZEXT1664(auVar18);
        local_60 = local_60 + 1;
        sVar13 = k + 1;
        pPVar4 = prims->items;
        pPVar4[k].upper.field_0.field_1 = aVar6;
        pPVar4[k].lower.field_0.field_1 = aVar5;
        uVar15 = r->_end;
      }
LAB_0198e6fc:
      aVar25 = auVar27._0_16_;
      aVar22 = auVar24._0_16_;
      aVar26 = auVar19._0_16_;
      aVar23 = auVar21._0_16_;
      uVar14 = uVar14 + 1;
      k = sVar13;
    } while (uVar14 < uVar15);
  }
  else {
    aVar23.m128[2] = INFINITY;
    aVar23._0_8_ = 0x7f8000007f800000;
    aVar23.m128[3] = INFINITY;
    aVar26.m128[2] = -INFINITY;
    aVar26._0_8_ = 0xff800000ff800000;
    aVar26.m128[3] = -INFINITY;
    local_60 = 0;
    aVar22 = aVar23;
    aVar25 = aVar26;
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar23;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar26;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar22;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar25;
  __return_storage_ptr__->end = local_60;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(mvector<PrimRef>& prims, size_t itime, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          BBox3fa bounds = empty;
          if (!buildBounds(j,itime,bounds)) continue;
          const PrimRef prim(bounds,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }